

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_70cf1::ir_constant_propagation_visitor::visit_enter
          (ir_constant_propagation_visitor *this,ir_call *ir)

{
  exec_node *local_88;
  ir_rvalue *local_80;
  ir_rvalue *local_70;
  ir_rvalue *local_50;
  ir_rvalue *new_param;
  ir_rvalue *param;
  ir_variable *sig_param;
  exec_node *__next2;
  exec_node *__next1;
  exec_node *actual_node;
  exec_node *formal_node;
  ir_call *ir_local;
  ir_constant_propagation_visitor *this_local;
  
  actual_node = (ir->callee->parameters).head_sentinel.next;
  __next1 = (ir->actual_parameters).head_sentinel.next;
  sig_param = (ir_variable *)__next1->next;
  formal_node = (exec_node *)ir;
  ir_local = (ir_call *)this;
  for (__next2 = actual_node->next; __next2 != (exec_node *)0x0 && sig_param != (ir_variable *)0x0;
      __next2 = __next2->next) {
    if (actual_node == (exec_node *)0x0) {
      local_70 = (ir_rvalue *)0x0;
    }
    else {
      local_70 = (ir_rvalue *)&actual_node[-1].prev;
    }
    param = local_70;
    if (__next1 == (exec_node *)0x0) {
      local_80 = (ir_rvalue *)0x0;
    }
    else {
      local_80 = (ir_rvalue *)&__next1[-1].prev;
    }
    new_param = local_80;
    if (((local_70[1].super_ir_instruction.ir_type >> 0xc & 0xf) != 7) &&
       ((local_70[1].super_ir_instruction.ir_type >> 0xc & 0xf) != 8)) {
      local_50 = local_80;
      (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
        _vptr_ir_hierarchical_visitor[0x28])(this,&local_50);
      if (local_50 == new_param) {
        (*(new_param->super_ir_instruction)._vptr_ir_instruction[3])(new_param,this);
      }
      else {
        local_88 = (exec_node *)0x0;
        if (local_50 != (ir_rvalue *)0x0) {
          local_88 = &(local_50->super_ir_instruction).super_exec_node;
        }
        exec_node::replace_with(&(new_param->super_ir_instruction).super_exec_node,local_88);
      }
    }
    actual_node = __next2;
    __next1 = (exec_node *)sig_param;
    sig_param = (ir_variable *)(sig_param->super_ir_instruction)._vptr_ir_instruction;
  }
  exec_list::make_empty(this->acp);
  this->killed_all = true;
  return visit_continue_with_parent;
}

Assistant:

ir_visitor_status
ir_constant_propagation_visitor::visit_enter(ir_call *ir)
{
   /* Do constant propagation on call parameters, but skip any out params */
   foreach_two_lists(formal_node, &ir->callee->parameters,
                     actual_node, &ir->actual_parameters) {
      ir_variable *sig_param = (ir_variable *) formal_node;
      ir_rvalue *param = (ir_rvalue *) actual_node;
      if (sig_param->data.mode != ir_var_function_out
          && sig_param->data.mode != ir_var_function_inout) {
	 ir_rvalue *new_param = param;
	 handle_rvalue(&new_param);
         if (new_param != param)
	    param->replace_with(new_param);
	 else
	    param->accept(this);
      }
   }

   /* Since we're unlinked, we don't (necssarily) know the side effects of
    * this call.  So kill all copies.
    */
   acp->make_empty();
   this->killed_all = true;

   return visit_continue_with_parent;
}